

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

void spirv_cross::fixup_radix_point(char *str,char radix_point)

{
  if (radix_point != '.') {
    for (; *str != '\0'; str = str + 1) {
      if (*str == radix_point) {
        *str = '.';
      }
    }
  }
  return;
}

Assistant:

static inline void fixup_radix_point(char *str, char radix_point)
{
	// Setting locales is a very risky business in multi-threaded program,
	// so just fixup locales instead. We only need to care about the radix point.
	if (radix_point != '.')
	{
		while (*str != '\0')
		{
			if (*str == radix_point)
				*str = '.';
			str++;
		}
	}
}